

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  int local_19c;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_51;
  undefined1 local_50 [8];
  tm time_struct;
  TimeInMillis ms_local;
  
  time_struct.tm_zone = (char *)this;
  bVar1 = PortableLocaltime((long)this / 1000,(tm *)local_50);
  if (bVar1) {
    local_19c = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_198,&local_19c);
    std::operator+(&local_178,&local_198,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1c0,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_158,&local_178,&local_1c0);
    std::operator+(&local_138,&local_158,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1e0,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_118,&local_138,&local_1e0);
    std::operator+(&local_f8,&local_118,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_200,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_d8,&local_f8,&local_200);
    std::operator+(&local_b8,&local_d8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_220,(String *)(ulong)(uint)local_50._4_4_,value_02);
    std::operator+(&local_98,&local_b8,&local_220);
    std::operator+(&local_78,&local_98,":");
    String::FormatIntWidth2_abi_cxx11_(&local_240,(String *)(ulong)(uint)local_50._0_4_,value_03);
    std::operator+(__return_storage_ptr__,&local_78,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}